

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O0

void __thiscall Fl_Window::show(Fl_Window *this,int argc,char **argv)

{
  char cVar1;
  Display *pDVar2;
  int iVar3;
  int iVar4;
  Fl_Window *pFVar5;
  Fl_Widget *o;
  char *pcVar6;
  size_t sVar7;
  Window WVar8;
  char *pcVar9;
  bool local_7b;
  bool local_7a;
  bool local_79;
  char *local_70;
  char *q;
  char *p;
  char *buffer;
  int n;
  int j;
  Fl_Widget *r;
  uint local_40;
  uint gh;
  uint gw;
  int gy;
  int gx;
  int fl;
  char *val;
  char *key;
  char **argv_local;
  Fl_Window *pFStack_10;
  int argc_local;
  Fl_Window *this_local;
  
  key = (char *)argv;
  argv_local._4_4_ = argc;
  pFStack_10 = this;
  if ((argc != 0) && (arg_called == '\0')) {
    Fl::args(argc,argv);
  }
  Fl::get_system_colors();
  val = (char *)0x0;
  pFVar5 = Fl::first_window();
  if (pFVar5 != (Fl_Window *)0x0) {
    pFVar5 = Fl::first_window();
    val = xclass(pFVar5);
  }
  if (val == (char *)0x0) {
    val = "fltk";
  }
  _gx = (char *)XGetDefault(fl_display,val,"dndTextOps");
  if (_gx != (char *)0x0) {
    iVar3 = strcasecmp(_gx,"true");
    local_79 = true;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(_gx,"on");
      local_79 = true;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(_gx,"yes");
        local_79 = iVar3 == 0;
      }
    }
    Fl::dnd_text_ops((uint)local_79);
  }
  _gx = (char *)XGetDefault(fl_display,val,"tooltips");
  if (_gx != (char *)0x0) {
    iVar3 = strcasecmp(_gx,"true");
    local_7a = true;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(_gx,"on");
      local_7a = true;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(_gx,"yes");
        local_7a = iVar3 == 0;
      }
    }
    Fl_Tooltip::enable((uint)local_7a);
  }
  _gx = (char *)XGetDefault(fl_display,val,"visibleFocus");
  if (_gx != (char *)0x0) {
    iVar3 = strcasecmp(_gx,"true");
    local_7b = true;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(_gx,"on");
      local_7b = true;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(_gx,"yes");
        local_7b = iVar3 == 0;
      }
    }
    Fl::visible_focus((uint)local_7b);
  }
  if ((show::beenhere == '\0') && (geometry != (char *)0x0)) {
    gy = 0;
    gw = Fl_Widget::x((Fl_Widget *)this);
    gh = Fl_Widget::y((Fl_Widget *)this);
    local_40 = Fl_Widget::w((Fl_Widget *)this);
    r._4_4_ = Fl_Widget::h((Fl_Widget *)this);
    gy = XParseGeometry(geometry,&gw,&gh,&local_40,(long)&r + 4);
    if ((gy & 0x10U) != 0) {
      iVar3 = Fl::w();
      iVar4 = Fl_Widget::w((Fl_Widget *)this);
      gw = (iVar3 - iVar4) + gw;
    }
    if ((gy & 0x20U) != 0) {
      iVar3 = Fl::h();
      iVar4 = Fl_Widget::h((Fl_Widget *)this);
      gh = (iVar3 - iVar4) + gh;
    }
    o = Fl_Group::resizable(&this->super_Fl_Group);
    if (o == (Fl_Widget *)0x0) {
      Fl_Group::resizable(&this->super_Fl_Group,(Fl_Widget *)this);
    }
    if ((gy & 3U) == 0) {
      Fl_Widget::size((Fl_Widget *)this,local_40,r._4_4_);
    }
    else {
      Fl_Widget::x((Fl_Widget *)this,-1);
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (this,(ulong)gw,(ulong)gh,(ulong)local_40,(ulong)r._4_4_);
    }
    Fl_Group::resizable(&this->super_Fl_Group,o);
  }
  if (::name == (char *)0x0) {
    pcVar6 = xclass(this);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = fl_filename_name(*(char **)key);
      xclass(this,pcVar6);
    }
  }
  else {
    xclass(this,::name);
    ::name = (char *)0x0;
  }
  if (::title == (char *)0x0) {
    pcVar6 = label(this);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = xclass(this);
      label(this,pcVar6);
    }
  }
  else {
    label(this,::title);
    ::title = (char *)0x0;
  }
  if (show::beenhere == '\0') {
    show::beenhere = '\x01';
    pcVar6 = Fl::scheme();
    Fl::scheme(pcVar6);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  buffer._0_4_ = 0;
  for (buffer._4_4_ = 0; buffer._4_4_ < argv_local._4_4_; buffer._4_4_ = buffer._4_4_ + 1) {
    sVar7 = strlen(*(char **)(key + (long)buffer._4_4_ * 8));
    buffer._0_4_ = (int)buffer + (int)sVar7 + 1;
  }
  pcVar6 = (char *)operator_new__((long)(int)buffer);
  q = pcVar6;
  for (buffer._4_4_ = 0; pDVar2 = fl_display, buffer._4_4_ < argv_local._4_4_;
      buffer._4_4_ = buffer._4_4_ + 1) {
    local_70 = *(char **)(key + (long)buffer._4_4_ * 8);
    do {
      cVar1 = *local_70;
      pcVar9 = q + 1;
      *q = cVar1;
      local_70 = local_70 + 1;
      q = pcVar9;
    } while (cVar1 != '\0');
  }
  WVar8 = fl_xid(this);
  XChangeProperty(pDVar2,WVar8,0x22,0x1f,8,0,pcVar6,((int)q - (int)pcVar6) + -1);
  if (pcVar6 != (char *)0x0) {
    operator_delete__(pcVar6);
  }
  return;
}

Assistant:

void Fl_Window::show(int argc, char **argv) {
  if (argc && !arg_called) Fl::args(argc,argv);

  Fl::get_system_colors();

#if !defined(WIN32) && !defined(__APPLE__)
  // Get defaults for drag-n-drop and focus...
  const char *key = 0, *val;

  if (Fl::first_window()) key = Fl::first_window()->xclass();
  if (!key) key = "fltk";

  val = XGetDefault(fl_display, key, "dndTextOps");
  if (val) Fl::dnd_text_ops(strcasecmp(val, "true") == 0 ||
                            strcasecmp(val, "on") == 0 ||
                            strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "tooltips");
  if (val) Fl_Tooltip::enable(strcasecmp(val, "true") == 0 ||
                              strcasecmp(val, "on") == 0 ||
                              strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "visibleFocus");
  if (val) Fl::visible_focus(strcasecmp(val, "true") == 0 ||
                             strcasecmp(val, "on") == 0 ||
                             strcasecmp(val, "yes") == 0);
#endif // !WIN32 && !__APPLE__

  // set colors first, so background_pixel is correct:
  static char beenhere;
  if (!beenhere) {
    if (geometry) {
      int fl = 0, gx = x(), gy = y(); unsigned int gw = w(), gh = h();
      fl = XParseGeometry(geometry, &gx, &gy, &gw, &gh);
      if (fl & XNegative) gx = Fl::w()-w()+gx;
      if (fl & YNegative) gy = Fl::h()-h()+gy;
      //  int mw,mh; minsize(mw,mh);
      //  if (mw > gw) gw = mw;
      //  if (mh > gh) gh = mh;
      Fl_Widget *r = resizable();
      if (!r) resizable(this);
      // for WIN32 we assume window is not mapped yet:
      if (fl & (XValue | YValue))
	x(-1), resize(gx,gy,gw,gh);
      else
	size(gw,gh);
      resizable(r);
    }
  }

  // set the class, which is used by X version of get_system_colors:
  if (name) {xclass(name); name = 0;}
  else if (!xclass()) xclass(fl_filename_name(argv[0]));

  if (title) {label(title); title = 0;}
  else if (!label()) label(xclass());

  if (!beenhere) {
    beenhere = 1;
    Fl::scheme(Fl::scheme()); // opens display!  May call Fl::fatal()
  }

  // Show the window AFTER we have set the colors and scheme.
  show();

#if !defined(WIN32) && !defined(__APPLE__)
  // set the command string, used by state-saving window managers:
  int j;
  int n=0; for (j=0; j<argc; j++) n += strlen(argv[j])+1;
  char *buffer = new char[n];
  char *p = buffer;
  for (j=0; j<argc; j++) for (const char *q = argv[j]; (*p++ = *q++););
  XChangeProperty(fl_display, fl_xid(this), XA_WM_COMMAND, XA_STRING, 8, 0,
		  (unsigned char *)buffer, p-buffer-1);
  delete[] buffer;
#endif // !WIN32 && !__APPLE__
}